

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O2

void __thiscall
r_exec::ConstGuardBuilder::_build
          (ConstGuardBuilder *this,Code *mdl,uint16_t fwd_opcode,uint16_t bwd_opcode,
          _Fact *premise_pattern,_Fact *cause_pattern,uint16_t *write_index)

{
  char cVar1;
  ushort uVar2;
  uint16_t q0;
  uint16_t t0;
  uint16_t t1;
  int iVar3;
  undefined4 extraout_var;
  
  (*(mdl->super__Object)._vptr__Object[4])(mdl,1);
  uVar2 = r_code::Atom::asIndex();
  (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar2);
  cVar1 = r_code::Atom::getAtomCount();
  if (cVar1 == '\0') {
    iVar3 = (*(premise_pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object._vptr__Object[9])(premise_pattern,0);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x20))
              ((long *)CONCAT44(extraout_var,iVar3),3);
    q0 = r_code::Atom::asIndex();
    (*(premise_pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[4])(premise_pattern,2);
    t0 = r_code::Atom::asIndex();
    (*(premise_pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[4])(premise_pattern,3);
    t1 = r_code::Atom::asIndex();
  }
  else {
    t1 = 2;
    t0 = 1;
    q0 = 0;
  }
  _build(this,mdl,fwd_opcode,bwd_opcode,q0,t0,t1,write_index);
  return;
}

Assistant:

void ConstGuardBuilder::_build(Code *mdl, uint16_t fwd_opcode, uint16_t bwd_opcode, _Fact *premise_pattern, _Fact *cause_pattern, uint16_t &write_index) const
{
    uint16_t q0;
    uint16_t t0;
    uint16_t t1;
    uint16_t tpl_arg_set_index = mdl->code(MDL_TPL_ARGS).asIndex();

    if (mdl->code(tpl_arg_set_index).getAtomCount() == 0) {
        q0 = premise_pattern->get_reference(0)->code(MK_VAL_VALUE).asIndex();
        t0 = premise_pattern->code(FACT_AFTER).asIndex();
        t1 = premise_pattern->code(FACT_BEFORE).asIndex();
    } else { // use the tpl args.
        q0 = 0;
        t0 = 1;
        t1 = 2;
    }

    _build(mdl, fwd_opcode, bwd_opcode, q0, t0, t1, write_index);
}